

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O2

QDBusObjectPath * qdbus_cast<QDBusObjectPath>(QDBusObjectPath *__return_storage_ptr__,QVariant *v)

{
  bool bVar1;
  long in_FS_OFFSET;
  QMetaType local_30;
  QMetaType local_28 [2];
  
  local_28[1].d_ptr = *(QMetaTypeInterface **)(in_FS_OFFSET + 0x28);
  local_28[0].d_ptr = (QMetaTypeInterface *)QVariant::metaType();
  local_30.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusArgument>::metaType;
  bVar1 = comparesEqual(local_28,&local_30);
  if (bVar1) {
    qvariant_cast<QDBusArgument>((QVariant *)local_28);
    qdbus_cast<QDBusObjectPath>(__return_storage_ptr__,(QDBusArgument *)local_28);
    QDBusArgument::~QDBusArgument((QDBusArgument *)local_28);
  }
  else {
    qvariant_cast<QDBusObjectPath>(__return_storage_ptr__,v);
  }
  if ((QMetaTypeInterface *)*(long *)(in_FS_OFFSET + 0x28) == local_28[1].d_ptr) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline T qdbus_cast(const QVariant &v)
{
    if (v.metaType() == QMetaType::fromType<QDBusArgument>())
        return qdbus_cast<T>(qvariant_cast<QDBusArgument>(v));
    else
        return qvariant_cast<T>(v);
}